

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O0

QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs>
 __thiscall
Indexing::
SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs>
::
Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
::next(Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
       *this)

{
  bool bVar1;
  Rhs *data;
  AbstractingUnifier *unifier;
  TermList in_RDI;
  TypedTermList TVar2;
  Renaming normalizer;
  Rhs *ld;
  Renaming *in_stack_ffffffffffffff68;
  Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
  *in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 uVar3;
  SortId in_stack_ffffffffffffff90;
  Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
  *in_stack_ffffffffffffffb8;
  QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs>
  local_10;
  
  do {
    bVar1 = hasLeafData(in_stack_ffffffffffffff70);
    uVar3 = false;
    if (!bVar1) {
      uVar3 = findNextLeaf(in_stack_ffffffffffffffb8);
    }
  } while ((bool)uVar3 != false);
  Lib::
  Option<Lib::VirtualIterator<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs_*>_>
  ::operator->((Option<Lib::VirtualIterator<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs_*>_>
                *)0x51e09b);
  data = Lib::
         VirtualIterator<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs_*>
         ::next((VirtualIterator<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs_*>
                 *)0x51e0a3);
  if ((*(byte *)(in_RDI._content + 0x58) & 1) != 0) {
    Kernel::Renaming::Renaming((Renaming *)in_stack_ffffffffffffff70);
    TVar2 = Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs::
            key((Rhs *)CONCAT17(uVar3,in_stack_ffffffffffffff80));
    TVar2._sort = TVar2._sort._content;
    TVar2._sort._content = in_stack_ffffffffffffff90._content;
    TVar2.super_TermList._content = in_RDI._content;
    Kernel::Renaming::normalizeVariables
              ((Renaming *)CONCAT17(uVar3,in_stack_ffffffffffffff80),TVar2);
    RetrievalAlgorithms::
    UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>
    ::bdRecord((UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>
                *)TVar2._sort._content,(BacktrackData *)in_stack_ffffffffffffff68);
    *(undefined1 *)(in_RDI._content + 0xb8) = 1;
    RetrievalAlgorithms::
    UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>
    ::denormalize((UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>
                   *)TVar2._sort._content,in_stack_ffffffffffffff68);
    Kernel::Renaming::~Renaming((Renaming *)0x51e13c);
  }
  unifier = RetrievalAlgorithms::
            UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>
            ::unifier((UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>
                       *)0x51e162);
  QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs>
  ::QueryRes(&local_10,unifier,data);
  return local_10;
}

Assistant:

QueryRes<Unifier, LeafData> next()
      {
        while(!hasLeafData() && findNextLeaf()) {}
        ASS(hasLeafData());

        ASS(!_normalizationRecording);

        auto ld = _leafData->next();
        if (_retrieveSubstitution) {
            Renaming normalizer;
            normalizer.normalizeVariables(ld->key());

            ASS(_normalizationBacktrackData.isEmpty());
            _algo.bdRecord(_normalizationBacktrackData);
            _normalizationRecording=true;

            _algo.denormalize(normalizer);
        }

        DEBUG_QUERY(1, "leaf data: ", *ld)
        return QueryRes(_algo.unifier(), ld);
      }